

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctstr_iincl(char *str,char *check_incl)

{
  int iVar1;
  char *str_00;
  char *check_incl_00;
  
  str_00 = fctstr_clone_lower(str);
  check_incl_00 = fctstr_clone_lower(check_incl);
  iVar1 = fctstr_incl(str_00,check_incl_00);
  free(str_00);
  free(check_incl_00);
  return iVar1;
}

Assistant:

static int
fctstr_iincl(char const *str, char const *check_incl)
{
    /* Going to do this with a memory allocation to save coding
    time. In the future this can be rewritten. Both clone_lower
    and _incl are NULL tolerant. */
    char *lstr = fctstr_clone_lower(str);
    char *lcheck_incl = fctstr_clone_lower(check_incl);
    int found = fctstr_incl(lstr, lcheck_incl);
    free(lstr);
    free(lcheck_incl);
    return found;
}